

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresses.cpp
# Opt level: O2

UniValue * __thiscall
wallet::DescribeWalletAddressVisitor::operator()
          (UniValue *__return_storage_ptr__,DescribeWalletAddressVisitor *this,
          ScriptHash *scripthash)

{
  SigningProvider *pSVar1;
  int iVar2;
  long in_FS_OFFSET;
  string in_stack_ffffffffffffff78;
  CScript subscript;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = local_38;
  local_40 = 0;
  local_38[0] = 0;
  UniValue::UniValue(__return_storage_ptr__,VOBJ,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string((string *)&local_48);
  subscript.super_CScriptBase._union._16_8_ = 0;
  subscript.super_CScriptBase._24_8_ = 0;
  subscript.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  subscript.super_CScriptBase._union._8_8_ = 0;
  pSVar1 = this->provider;
  if (pSVar1 != (SigningProvider *)0x0) {
    ToScriptID((CScriptID *)&stack0xffffffffffffff84,scripthash);
    iVar2 = (*pSVar1->_vptr_SigningProvider[2])(pSVar1,&stack0xffffffffffffff84,&subscript);
    if ((char)iVar2 != '\0') {
      ProcessSubScript(this,&subscript,__return_storage_ptr__);
    }
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&subscript.super_CScriptBase);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue operator()(const ScriptHash& scripthash) const
    {
        UniValue obj(UniValue::VOBJ);
        CScript subscript;
        if (provider && provider->GetCScript(ToScriptID(scripthash), subscript)) {
            ProcessSubScript(subscript, obj);
        }
        return obj;
    }